

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dtoa.c
# Opt level: O0

int hi0bits(uint32 x)

{
  int local_14;
  uint local_10;
  int k;
  uint32 x_local;
  
  local_14 = 0;
  local_10 = x;
  if ((x & 0xffff0000) == 0) {
    local_14 = 0x10;
    local_10 = x << 0x10;
  }
  if ((local_10 & 0xff000000) == 0) {
    local_14 = local_14 + 8;
    local_10 = local_10 << 8;
  }
  if ((local_10 & 0xf0000000) == 0) {
    local_14 = local_14 + 4;
    local_10 = local_10 << 4;
  }
  if ((local_10 & 0xc0000000) == 0) {
    local_14 = local_14 + 2;
    local_10 = local_10 << 2;
  }
  if (((local_10 & 0x80000000) == 0) && (local_14 = local_14 + 1, (local_10 & 0x40000000) == 0)) {
    k = 0x20;
  }
  else {
    k = local_14;
  }
  return k;
}

Assistant:

static int
hi0bits(ULong x)
{
    int k = 0;

    if (!(x & 0xffff0000)) {
        k = 16;
        x <<= 16;
    }
    if (!(x & 0xff000000)) {
        k += 8;
        x <<= 8;
    }
    if (!(x & 0xf0000000)) {
        k += 4;
        x <<= 4;
    }
    if (!(x & 0xc0000000)) {
        k += 2;
        x <<= 2;
    }
    if (!(x & 0x80000000)) {
        k++;
        if (!(x & 0x40000000))
            return 32;
    }
    return k;
}